

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

Node * __thiscall Node::add_child(Node *this,player_move *playerMove)

{
  pointer *pppNVar1;
  iterator __position;
  Node *node;
  Node *local_18;
  
  local_18 = (Node *)operator_new(0x40);
  local_18->m_parent_node = this;
  local_18->exploration = 0.7;
  local_18->m_move = playerMove;
  (local_18->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18->m_wins = 0;
  local_18->m_visits = 0;
  local_18->m_avails = 1;
  __position._M_current =
       (this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)&this->m_children,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppNVar1 = &(this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return local_18;
}

Assistant:

Node* Node::add_child(player_move playerMove)
{
    Node* node = new Node(&playerMove, this);
    this->m_children.push_back(node);
    return node;
}